

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
::rebalance_right_to_left
          (btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
           *this,int to_move,
          btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
          *right,allocator_type *alloc)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  field_type fVar4;
  btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar5;
  btree_node<gtl::internal_btree::map_params<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *pbVar6;
  template_ElementType<2L> *ptVar7;
  template_ElementType<2L> *ptVar8;
  template_ElementType<2L> *result;
  template_ElementType<1L> *ptVar9;
  ulong n;
  int i;
  int iVar10;
  template_ElementType<2L> *local_38;
  
  pbVar5 = parent(this);
  pbVar6 = parent(right);
  if (pbVar5 != pbVar6) {
    __assert_fail("parent() == right->parent()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x5fc,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  bVar1 = position(this);
  bVar2 = position(right);
  if (bVar1 + 1 != (uint)bVar2) {
    __assert_fail("position() + 1 == right->position()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x5fd,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  bVar1 = count(right);
  bVar2 = count(this);
  if (bVar1 < bVar2) {
    __assert_fail("right->count() >= count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                  ,0x5fe,
                  "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                 );
  }
  if (0 < to_move) {
    bVar1 = count(right);
    if ((uint)bVar1 < (uint)to_move) {
      __assert_fail("to_move <= right->count()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                    ,0x600,
                    "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                   );
    }
    bVar1 = count(this);
    pbVar5 = parent(this);
    bVar2 = position(this);
    local_38 = btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
               ::GetField<2l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                               *)pbVar5);
    local_38 = local_38 + bVar2;
    btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
    ::value_init<absl::container_internal::slot_type<int,int>*>
              ((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                *)this,(ulong)bVar1,alloc,&local_38);
    n = (ulong)(to_move - 1);
    bVar1 = count(this);
    iVar10 = 0;
    uninitialized_move_n(right,n,0,(ulong)bVar1 + 1,this,alloc);
    ptVar7 = btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
             ::GetField<2l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)right);
    pbVar5 = parent(this);
    bVar1 = position(this);
    ptVar8 = btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
             ::GetField<2l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)pbVar5);
    ptVar8[bVar1].value.first = ptVar7[n].value.first;
    *(undefined4 *)((long)ptVar8 + (ulong)bVar1 * 8 + 4) = *(undefined4 *)((long)ptVar7 + n * 8 + 4)
    ;
    ptVar7 = btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
             ::GetField<2l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)right);
    bVar1 = count(right);
    ptVar8 = btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
             ::GetField<2l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)right);
    result = btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
             ::GetField<2l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)right);
    absl::container_internal::slot_type<int,int>::move<std::allocator<std::pair<int_const,int>>>
              (alloc,ptVar7 + (uint)to_move,ptVar8 + bVar1,result);
    bVar1 = count(right);
    value_destroy_n(right,(long)(int)((uint)bVar1 - to_move),(ulong)(uint)to_move,alloc);
    bVar3 = leaf(this);
    if (!bVar3) {
      for (; to_move != iVar10; iVar10 = iVar10 + 1) {
        bVar1 = count(this);
        pbVar5 = child(right,iVar10);
        init_child(this,(uint)bVar1 + iVar10 + 1,pbVar5);
      }
      iVar10 = 0;
      while( true ) {
        bVar1 = count(right);
        if ((int)((uint)bVar1 - to_move) < iVar10) break;
        bVar1 = max_count(right);
        if ((int)(uint)bVar1 < to_move + iVar10) {
          __assert_fail("i + to_move <= right->max_count()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                        ,0x618,
                        "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
                       );
        }
        pbVar5 = child(right,to_move + iVar10);
        init_child(right,iVar10,pbVar5);
        btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
        ::GetField<3l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                        *)right);
        iVar10 = iVar10 + 1;
      }
    }
    fVar4 = count(this);
    ptVar9 = btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
             ::GetField<1l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)this);
    ptVar9[2] = fVar4 + (char)to_move;
    fVar4 = count(right);
    ptVar9 = btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
             ::GetField<1l>((btree_node<gtl::internal_btree::map_params<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>,256,false>>
                             *)right);
    ptVar9[2] = fVar4 - (char)to_move;
    return;
  }
  __assert_fail("to_move >= 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/btree.h"
                ,0x5ff,
                "void gtl::internal_btree::btree_node<gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::rebalance_right_to_left(const int, btree_node<Params> *, allocator_type *) [Params = gtl::internal_btree::map_params<int, int, std::less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
               );
}

Assistant:

void btree_node<P>::rebalance_right_to_left(const int to_move,
                                            btree_node *right,
                                            allocator_type *alloc) {
  assert(parent() == right->parent());
  assert(position() + 1 == right->position());
  assert(right->count() >= count());
  assert(to_move >= 1);
  assert(to_move <= right->count());

  // 1) Move the delimiting value in the parent to the left node.
  value_init(count(), alloc, parent()->slot(position()));

  // 2) Move the (to_move - 1) values from the right node to the left node.
  right->uninitialized_move_n(to_move - 1, 0, count() + 1, this, alloc);

  // 3) Move the new delimiting value to the parent from the right node.
  slot_type::move(alloc, right->slot(to_move - 1), parent()->slot(position()));

  // 4) Shift the values in the right node to their correct position.
  slot_type::move(alloc, right->slot(to_move), right->slot(right->count()),
                  right->slot(0));

  // 5) Destroy the now-empty to_move entries in the right node.
  right->value_destroy_n(right->count() - to_move, to_move, alloc);

  if (!leaf()) {
    // Move the child pointers from the right to the left node.
    for (int i = 0; i < to_move; ++i) {
      init_child(count() + i + 1, right->child(i));
    }
    for (int i = 0; i <= right->count() - to_move; ++i) {
      assert(i + to_move <= right->max_count());
      right->init_child(i, right->child(i + to_move));
      right->clear_child(i + to_move);
    }
  }

  // Fixup the counts on the left and right nodes.
  set_count(count() + to_move);
  right->set_count(right->count() - to_move);
}